

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

_Bool unshield_file_save_old(Unshield *unshield,int index,char *filename)

{
  ulong uVar1;
  _Bool _Var2;
  uint uVar3;
  uint8_t *buffer;
  void *buffer_00;
  FileDescriptor *file_descriptor;
  FILE *pFVar4;
  uint64_t uVar5;
  char *pcVar6;
  char *pcVar7;
  FILE *pFVar8;
  size_t sVar9;
  FILE *__s;
  FILE *__ptr;
  longlong lVar10;
  FILE *__s_00;
  size_t sVar11;
  uint8_t *puVar12;
  char *in_RCX;
  int line;
  uint8_t *extraout_RDX;
  uint8_t *pattern;
  uint8_t *extraout_RDX_00;
  undefined8 uVar13;
  uint8_t *buffer_01;
  ulong uVar14;
  FILE *__n;
  size_t sVar15;
  long lVar16;
  undefined1 auVar17 [16];
  size_t local_e8;
  uint64_t local_c0;
  uint8_t *local_a0;
  uint local_98;
  undefined8 local_90;
  void *local_88;
  undefined4 local_80;
  size_t local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  
  buffer = (uint8_t *)malloc(0x10000);
  buffer_00 = malloc(0x10000);
  if (unshield != (Unshield *)0x0) {
    file_descriptor = unshield_get_file_descriptor(unshield,index);
    if (file_descriptor != (FileDescriptor *)0x0) {
      if (((file_descriptor->flags & 8) != 0) || (file_descriptor->data_offset == 0))
      goto LAB_00103b81;
      if ((file_descriptor->link_flags & 1) != 0) {
        _Var2 = unshield_file_save_old(unshield,file_descriptor->link_previous,filename);
        pFVar8 = (FILE *)0x0;
        pFVar4 = (FILE *)0x0;
        goto LAB_00103b86;
      }
      pFVar4 = (FILE *)unshield_reader_create(unshield,index,file_descriptor);
      if (pFVar4 == (FILE *)0x0) {
        pcVar6 = "Failed to create data reader for file %i";
        line = 0x454;
        goto LAB_00103b77;
      }
      uVar5 = unshield_fsize(unshield,(FILE *)pFVar4->_IO_write_base);
      if (uVar5 == file_descriptor->data_offset) {
        in_RCX = "File %i is not inside the cabinet. Trying external file!";
        _unshield_log(1,"unshield_file_save_old",0x45a,
                      "File %i is not inside the cabinet. Trying external file!",index);
        unshield_reader_destroy((UnshieldReader *)pFVar4);
        pcVar6 = unshield_file_name(unshield,index);
        pcVar7 = unshield_directory_name(unshield,file_descriptor->directory_index);
        pFVar8 = (FILE *)unshield_get_base_directory_name(unshield);
        sVar9 = unshield_get_path_max(unshield);
        __s = (FILE *)malloc(sVar9);
        __ptr = (FILE *)calloc(1,0x70);
        if (__ptr == (FILE *)0x0) {
LAB_00103c21:
          free(pFVar8);
          pFVar4 = (FILE *)0x0;
          pFVar8 = __s;
        }
        else {
          *(Unshield **)__ptr = unshield;
          *(int *)&__ptr->_IO_read_ptr = index;
          __ptr->_IO_read_end = (char *)file_descriptor;
          in_RCX = (char *)pFVar8;
          snprintf((char *)__s,sVar9,"%s/%s/%s",pFVar8,pcVar7,pcVar6);
          pFVar4 = fopen((char *)__s,"rb");
          __ptr->_IO_write_base = (char *)pFVar4;
          if (pFVar4 == (FILE *)0x0) {
            in_RCX = "Failed to open input file %s";
            _unshield_log(1,"unshield_reader_create_external",0x26f,"Failed to open input file %s",
                          __s);
            goto LAB_00103c21;
          }
          if ((file_descriptor->flags & 4) == 0) {
            pcVar6 = (char *)file_descriptor->expanded_size;
          }
          else {
            lVar10 = unshield_fsize(unshield,(FILE *)pFVar4);
            pcVar6 = (char *)file_descriptor->compressed_size;
            in_RCX = pcVar6 + -lVar10;
            if (0 < (long)in_RCX) {
              __n = (FILE *)0x4;
              if (in_RCX < (FILE *)0x4) {
                __n = (FILE *)in_RCX;
              }
              __s_00 = tmpfile();
              copy_file(unshield,(FILE *)pFVar4,(FILE *)__s_00);
              in_RCX = (char *)__s_00;
              fwrite("unshield_file_group_new" + -(long)__n,1,(size_t)__n,__s_00);
              fseek(__s_00,0,0);
              fclose(pFVar4);
              __ptr->_IO_write_base = (char *)__s_00;
              pcVar6 = (char *)((long)&__n->_flags + lVar10);
            }
          }
          *(int *)&__ptr->_chain = (int)pcVar6;
          pFVar4 = __ptr;
          __ptr = __s;
        }
        free(pFVar8);
        free(__ptr);
        if (pFVar4 == (FILE *)0x0) {
          pcVar6 = "Failed to create data reader for file %i";
          line = 0x45f;
          goto LAB_00103b77;
        }
      }
      if (filename == (char *)0x0) {
        pFVar8 = (FILE *)0x0;
      }
      else {
        pFVar8 = (FILE *)(*unshield->io_callbacks->fopen)(filename,"wb",unshield->io_userdata);
        if (pFVar8 == (FILE *)0x0) {
          pFVar8 = (FILE *)0x0;
          _unshield_log(1,"unshield_file_save_old",0x469,"Failed to open output file \'%s\'",
                        filename);
LAB_00104236:
          _Var2 = false;
          goto LAB_00103b86;
        }
      }
      uVar14 = (ulong)(uint)file_descriptor->expanded_size;
      sVar9 = 0x10000;
      local_c0 = 0;
      while (uVar3 = (uint)uVar14, uVar3 != 0) {
        if ((*(int *)&pFVar4->_chain == 0) &&
           (_Var2 = unshield_reader_open_volume
                              ((UnshieldReader *)pFVar4,*(int *)&pFVar4->_IO_read_base + 1), !_Var2)
           ) {
          _unshield_log(1,"unshield_file_save_old",0x47c,
                        "Failed to open volume %i to read %i more bytes",
                        (ulong)(*(int *)&pFVar4->_IO_read_base + 1));
          goto LAB_00104236;
        }
        if ((file_descriptor->flags & 4) == 0) {
          sVar15 = 0x10000;
          if (uVar3 < 0x10000) {
            sVar15 = uVar14;
          }
          _Var2 = unshield_reader_read((UnshieldReader *)pFVar4,buffer_00,sVar15);
          if (!_Var2) {
            _unshield_log(1,"unshield_file_save_old",0x4f2,
                          "Failed to read %i bytes from input cabinet file %i",sVar15,
                          (ulong)file_descriptor->volume);
            goto LAB_00104236;
          }
          if ((pFVar8 != (FILE *)0x0) &&
             (in_RCX = (char *)pFVar8,
             sVar11 = (*unshield->io_callbacks->fwrite)
                                (buffer_00,1,sVar15,pFVar8,unshield->io_userdata), sVar11 != sVar15)
             ) {
            _unshield_log(1,"unshield_file_save_old",0x4fc,"Failed to write %i bytes to file \'%s\'"
                          ,sVar15,filename);
            goto LAB_00104236;
          }
          uVar14 = (ulong)(uVar3 - (int)sVar15);
          local_c0 = local_c0 + sVar15;
        }
        else {
          local_e8 = (size_t)*(uint *)&pFVar4->_chain;
          while (sVar9 < local_e8) {
            sVar9 = sVar9 * 2;
            in_RCX = "increased input_buffer_size to 0x%x";
            _unshield_log(3,"unshield_file_save_old",0x48a,"increased input_buffer_size to 0x%x",
                          sVar9);
            buffer = (uint8_t *)realloc(buffer,sVar9);
            if (buffer == (uint8_t *)0x0) {
              __assert_fail("input_buffer",
                            "/workspace/llm4binary/github/license_c_cmakelists/twogood[P]unshield/lib/file.c"
                            ,0x48e,"_Bool unshield_file_save_old(Unshield *, int, const char *)");
            }
          }
          _Var2 = unshield_reader_read((UnshieldReader *)pFVar4,buffer,local_e8);
          puVar12 = extraout_RDX;
          buffer_01 = buffer;
          if (!_Var2) {
            pcVar6 = unshield_file_name(unshield,index);
            _unshield_log(1,"unshield_file_save_old",0x495,
                          "Failed to read 0x%x bytes of file %i (%s) from input cabinet file %i",
                          local_e8,(ulong)(uint)index,pcVar6,(ulong)file_descriptor->volume);
            goto LAB_00104236;
          }
          for (; (local_e8 != 0 && ((int)uVar14 != 0));
              uVar14 = (ulong)(uint)((int)uVar14 - (int)sVar15)) {
            puVar12 = find_bytes(buffer_01,local_e8,puVar12,(size_t)in_RCX);
            if (puVar12 == (uint8_t *)0x0) {
              pcVar6 = unshield_file_name(unshield,index);
              _unshield_log(1,"unshield_file_save_old",0x4a1,
                            "Could not find end of chunk for file %i (%s) from input cabinet file %i"
                            ,(ulong)(uint)index,pcVar6,(ulong)file_descriptor->volume);
              goto LAB_00104236;
            }
            while( true ) {
              lVar16 = (long)puVar12 - (long)buffer_01;
              uVar1 = lVar16 + 4;
              if ((local_e8 < uVar1 || local_e8 - uVar1 == 0) || ((buffer_01[uVar1] & 1) == 0))
              break;
              pcVar6 = "It seems like we have an end of chunk marker inside of a chunk.";
              _unshield_log(2,"unshield_file_save_old",0x4b6,
                            "It seems like we have an end of chunk marker inside of a chunk.");
              puVar12 = find_bytes(buffer_01 + uVar1,local_e8 - uVar1,pattern,(size_t)pcVar6);
              if (puVar12 == (uint8_t *)0x0) {
                pcVar6 = unshield_file_name(unshield,index);
                _Var2 = false;
                _unshield_log(1,"unshield_file_save_old",0x4bc,
                              "Could not find end of chunk for file %i (%s) from input cabinet file %i"
                              ,(ulong)(uint)index,pcVar6,(ulong)file_descriptor->volume);
                goto LAB_00103b86;
              }
            }
            _unshield_log(3,"unshield_file_save_old",0x4c3,"chunk_size = 0x%x",lVar16);
            buffer_01[lVar16] = '\0';
            local_98 = (uint)lVar16;
            local_80 = 0x10000;
            local_60 = 0;
            uStack_58 = 0;
            local_a0 = buffer_01;
            local_88 = buffer_00;
            uVar3 = inflateInit2_(&local_a0,0xfffffffffffffff1,"1.2.11",0x70);
            if (uVar3 != 0) {
LAB_001041a8:
              uVar13 = 0;
LAB_001041b9:
              _unshield_log(1,"unshield_file_save_old",0x4d0,
                            "Decompression failed with code %i. input_size=%i, volume_bytes_left=%i, volume=%i, read_bytes=%i"
                            ,(ulong)uVar3,local_e8,(ulong)*(uint *)&pFVar4->_chain,
                            (ulong)file_descriptor->volume,uVar13);
              goto LAB_00104236;
            }
            while (sVar15 = local_78, uVar13 = local_90, 1 < local_98) {
              uVar3 = inflate(&local_a0,5);
              if (uVar3 != 0) {
                inflateEnd(&local_a0);
                goto LAB_001041a8;
              }
            }
            uVar3 = inflateEnd(&local_a0);
            if (uVar3 != 0) goto LAB_001041b9;
            in_RCX = "read_bytes = 0x%x";
            _unshield_log(3,"unshield_file_save_old",0x4d5,"read_bytes = 0x%x",uVar13);
            puVar12 = extraout_RDX_00;
            if (pFVar8 != (FILE *)0x0) {
              in_RCX = (char *)pFVar8;
              auVar17 = (undefined1  [16])
                        (*unshield->io_callbacks->fwrite)
                                  (buffer_00,1,sVar15,pFVar8,unshield->io_userdata);
              puVar12 = auVar17._8_8_;
              if (sVar15 != auVar17._0_8_) {
                _Var2 = false;
                _unshield_log(1,"unshield_file_save_old",0x4e2,
                              "Failed to write %i bytes to file \'%s\'",sVar15,filename);
                goto LAB_00103b86;
              }
            }
            local_e8 = (local_e8 - lVar16) - 4;
            local_c0 = local_c0 + sVar15;
            buffer_01 = buffer_01 + lVar16 + 4;
          }
        }
      }
      _Var2 = true;
      if (file_descriptor->expanded_size != local_c0) {
        _Var2 = false;
        _unshield_log(1,"unshield_file_save_old",0x509,"Expanded size expected to be %i, but was %i"
                     );
      }
      goto LAB_00103b86;
    }
    pcVar6 = "Failed to get file descriptor for file %i";
    line = 0x441;
LAB_00103b77:
    _unshield_log(1,"unshield_file_save_old",line,pcVar6,(ulong)(uint)index);
  }
LAB_00103b81:
  pFVar8 = (FILE *)0x0;
  pFVar4 = (FILE *)0x0;
  _Var2 = false;
LAB_00103b86:
  unshield_reader_destroy((UnshieldReader *)pFVar4);
  if (pFVar8 != (FILE *)0x0) {
    (*unshield->io_callbacks->fclose)(pFVar8,unshield->io_userdata);
  }
  free(buffer);
  free(buffer_00);
  return _Var2;
}

Assistant:

bool unshield_file_save_old(Unshield* unshield, int index, const char* filename)/*{{{*/
{
  /* XXX: Thou Shalt Not Cut & Paste... */
  bool success = false;
  FILE* output = NULL;
  size_t input_buffer_size = BUFFER_SIZE;
  unsigned char* input_buffer   = (unsigned char*)malloc(BUFFER_SIZE);
  unsigned char* output_buffer  = (unsigned char*)malloc(BUFFER_SIZE);
  unsigned int bytes_left;
  uLong total_written = 0;
  UnshieldReader* reader = NULL;
  FileDescriptor* file_descriptor;

  if (!unshield)
    goto exit;

  if (!(file_descriptor = unshield_get_file_descriptor(unshield, index)))
  {
    unshield_error("Failed to get file descriptor for file %i", index);
    goto exit;
  }

  if ((file_descriptor->flags & FILE_INVALID) || 0 == file_descriptor->data_offset)
  {
    /* invalid file */
    goto exit;
  }

  if (file_descriptor->link_flags & LINK_PREV)
  {
    success = unshield_file_save_old(unshield, file_descriptor->link_previous, filename);
    goto exit;
  }

  reader = unshield_reader_create(unshield, index, file_descriptor);
  if (!reader)
  {
    unshield_error("Failed to create data reader for file %i", index);
    goto exit;
  }

  if (unshield_fsize(unshield, reader->volume_file) == (long)file_descriptor->data_offset)
  {
      unshield_error("File %i is not inside the cabinet. Trying external file!", index);
      unshield_reader_destroy(reader);
      reader = unshield_reader_create_external(unshield, index, file_descriptor);
      if (!reader)
      {
          unshield_error("Failed to create data reader for file %i", index);
          goto exit;
      }
  }

  if (filename) 
  {
    output = unshield_fopen(unshield, filename, "wb");
    if (!output)
    {
      unshield_error("Failed to open output file '%s'", filename);
      goto exit;
    }
  }

    bytes_left = file_descriptor->expanded_size;

#if VERBOSE >= 4
  unshield_trace("Bytes to write: %i", bytes_left);
#endif

  while (bytes_left > 0)
  {
    uLong bytes_to_write = 0;
    int result;

    if (reader->volume_bytes_left == 0 && !unshield_reader_open_volume(reader, reader->volume + 1))
    {
      unshield_error("Failed to open volume %i to read %i more bytes",
                     reader->volume + 1, bytes_left);
      goto exit;
    }

    if (file_descriptor->flags & FILE_COMPRESSED)
    {
      uLong read_bytes;
      size_t input_size = reader->volume_bytes_left;
      uint8_t* chunk_buffer;

      while (input_size > input_buffer_size) 
      {
        input_buffer_size *= 2;
#if VERBOSE >= 3
        unshield_trace("increased input_buffer_size to 0x%x", input_buffer_size);
#endif

        input_buffer = realloc(input_buffer, input_buffer_size);
        assert(input_buffer);
      }

      if (!unshield_reader_read(reader, input_buffer, input_size))
      {
#if VERBOSE
        unshield_error("Failed to read 0x%x bytes of file %i (%s) from input cabinet file %i", 
            input_size, index, unshield_file_name(unshield, index), file_descriptor->volume);
#endif
        goto exit;
      }

      for (chunk_buffer = input_buffer; input_size && bytes_left; )
      {
        size_t chunk_size;
        uint8_t* match = find_bytes(chunk_buffer, input_size, END_OF_CHUNK, sizeof(END_OF_CHUNK));
        if (!match)
        {
          unshield_error("Could not find end of chunk for file %i (%s) from input cabinet file %i",
              index, unshield_file_name(unshield, index), file_descriptor->volume);
          goto exit;
        }

        chunk_size = match - chunk_buffer;

        /*
           Detect when the chunk actually contains the end of chunk marker.

           Needed by Qtime.smk from "The Feeble Files - spanish version".

           The first bit of a compressed block is always zero, so we apply this
           workaround if it's a one.

           A possibly more proper fix for this would be to have
           unshield_uncompress_old eat compressed data and discard chunk
           markers inbetween.
           */
        while ((chunk_size + sizeof(END_OF_CHUNK)) < input_size &&
            chunk_buffer[chunk_size + sizeof(END_OF_CHUNK)] & 1)
        {
          unshield_warning("It seems like we have an end of chunk marker inside of a chunk.");
          chunk_size += sizeof(END_OF_CHUNK);
          match = find_bytes(chunk_buffer + chunk_size, input_size - chunk_size, END_OF_CHUNK, sizeof(END_OF_CHUNK));
          if (!match)
          {
            unshield_error("Could not find end of chunk for file %i (%s) from input cabinet file %i",
                index, unshield_file_name(unshield, index), file_descriptor->volume);
            goto exit;
          }
          chunk_size = match - chunk_buffer;
        }

#if VERBOSE >= 3
        unshield_trace("chunk_size = 0x%x", chunk_size);
#endif

        /* add a null byte to make inflate happy */
        chunk_buffer[chunk_size] = 0;

        bytes_to_write = BUFFER_SIZE;
        read_bytes = chunk_size;
        result = unshield_uncompress_old(output_buffer, &bytes_to_write, chunk_buffer, &read_bytes);

        if (Z_OK != result)
        {
          unshield_error("Decompression failed with code %i. input_size=%i, volume_bytes_left=%i, volume=%i, read_bytes=%i",
              result, input_size, reader->volume_bytes_left, file_descriptor->volume, read_bytes);
          goto exit;
        }

#if VERBOSE >= 3
        unshield_trace("read_bytes = 0x%x", read_bytes);
#endif

        chunk_buffer += chunk_size;
        chunk_buffer += sizeof(END_OF_CHUNK);

        input_size -= chunk_size;
        input_size -= sizeof(END_OF_CHUNK);

          bytes_left -= bytes_to_write;

          if (output) {
              if (bytes_to_write != unshield_fwrite(unshield, output_buffer, 1, bytes_to_write, output)) {
                  unshield_error("Failed to write %i bytes to file '%s'", bytes_to_write, filename);
                  goto exit;
              }
          }

        total_written += bytes_to_write;
      }
    }
    else
    {
      bytes_to_write = MIN(bytes_left, BUFFER_SIZE);

      if (!unshield_reader_read(reader, output_buffer, bytes_to_write))
      {
#if VERBOSE
        unshield_error("Failed to read %i bytes from input cabinet file %i", 
            bytes_to_write, file_descriptor->volume);
#endif
        goto exit;
      }

      bytes_left -= bytes_to_write;

      if (output) {
        if (bytes_to_write != unshield_fwrite(unshield, output_buffer, 1, bytes_to_write, output))
        {
          unshield_error("Failed to write %i bytes to file '%s'", bytes_to_write, filename);
          goto exit;
        }
      }

      total_written += bytes_to_write;

    }
  }

  if (file_descriptor->expanded_size != total_written)
  {
    unshield_error("Expanded size expected to be %i, but was %i", 
        file_descriptor->expanded_size, total_written);
    goto exit;
  }

  success = true;
  
exit:
  unshield_reader_destroy(reader);
  FCLOSE(unshield, output);
  FREE(input_buffer);
  FREE(output_buffer);
  return success;
}